

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# a_heresiarch.cpp
# Opt level: O3

int AF_A_SorcSpinBalls(VMFrameStack *stack,VMValue *param,int numparam,VMReturn *ret,int numret)

{
  VM_UBYTE VVar1;
  undefined8 *puVar2;
  PClass *pPVar3;
  int iVar4;
  undefined4 extraout_var;
  PClass *pPVar5;
  PClassActor *pPVar6;
  AActor *pAVar7;
  AActor *pAVar8;
  char *__assertion;
  bool bVar9;
  FName local_4c;
  DVector3 local_48;
  
  pPVar3 = AHeresiarch::RegistrationInfo.MyClass;
  if (numparam < 1) {
    __assertion = "(paramnum) < numparam";
    goto LAB_005dfcd1;
  }
  if ((param->field_0).field_3.Type == '\x03') {
    pAVar8 = (AActor *)(param->field_0).field_1.a;
    if ((param->field_0).field_1.atag == 1) {
      if (pAVar8 == (AActor *)0x0) {
LAB_005dfaca:
        pAVar8 = (AActor *)0x0;
      }
      else {
        pPVar5 = (pAVar8->super_DThinker).super_DObject.Class;
        if (pPVar5 == (PClass *)0x0) {
          iVar4 = (**(pAVar8->super_DThinker).super_DObject._vptr_DObject)(pAVar8);
          pPVar5 = (PClass *)CONCAT44(extraout_var,iVar4);
          (pAVar8->super_DThinker).super_DObject.Class = pPVar5;
        }
        bVar9 = pPVar5 != (PClass *)0x0;
        if (pPVar5 != pPVar3 && bVar9) {
          do {
            pPVar5 = pPVar5->ParentClass;
            bVar9 = pPVar5 != (PClass *)0x0;
            if (pPVar5 == pPVar3) break;
          } while (pPVar5 != (PClass *)0x0);
        }
        if (!bVar9) {
          __assertion = "self == NULL || self->IsKindOf(RUNTIME_CLASS(AHeresiarch))";
          goto LAB_005dfcd1;
        }
      }
      pPVar3 = AActor::RegistrationInfo.MyClass;
      if (numparam == 1) goto LAB_005dfb8a;
      VVar1 = param[1].field_0.field_3.Type;
      if (VVar1 != 0xff) {
        if (VVar1 != '\x03') goto LAB_005dfcc1;
        puVar2 = (undefined8 *)param[1].field_0.field_1.a;
        if (param[1].field_0.field_1.atag == 1) {
          if (puVar2 != (undefined8 *)0x0) {
            pPVar5 = (PClass *)puVar2[1];
            if (pPVar5 == (PClass *)0x0) {
              pPVar5 = (PClass *)(**(code **)*puVar2)(puVar2);
              puVar2[1] = pPVar5;
            }
            bVar9 = pPVar5 != (PClass *)0x0;
            if (pPVar5 != pPVar3 && bVar9) {
              do {
                pPVar5 = pPVar5->ParentClass;
                bVar9 = pPVar5 != (PClass *)0x0;
                if (pPVar5 == pPVar3) break;
              } while (pPVar5 != (PClass *)0x0);
            }
            if (!bVar9) {
              __assertion = "stateowner == NULL || stateowner->IsKindOf(RUNTIME_CLASS(AActor))";
              goto LAB_005dfcd1;
            }
          }
        }
        else if (puVar2 != (undefined8 *)0x0) goto LAB_005dfcc1;
      }
      if (((numparam < 3) || (VVar1 = param[2].field_0.field_3.Type, VVar1 == 0xff)) ||
         ((VVar1 == '\x03' &&
          ((param[2].field_0.field_1.atag == 8 || (param[2].field_0.field_1.a == (void *)0x0)))))) {
LAB_005dfb8a:
        pAVar8->SpawnState = pAVar8->SpawnState + 2;
        pAVar8->args[2] = 7;
        pAVar8->args[0] = 0;
        pAVar8->args[3] = 5;
        pAVar8->args[4] = 7;
        pAVar8[1].super_DThinker.super_DObject.Class = (PClass *)0x3ff0000000000000;
        local_48.Z = (pAVar8->Height - pAVar8->Floorclip) + (pAVar8->__Pos).Z;
        local_48.X = (pAVar8->__Pos).X;
        local_48.Y = (pAVar8->__Pos).Y;
        local_4c.Index = FName::NameManager::FindName(&FName::NameData,"SorcBall1",false);
        pPVar6 = ClassForSpawn(&local_4c);
        pAVar7 = AActor::StaticSpawn(pPVar6,&local_48,NO_REPLACE,false);
        if (pAVar7 != (AActor *)0x0) {
          (pAVar7->target).field_0.p = pAVar8;
          pAVar7->special2 = 0x12;
        }
        local_4c.Index = FName::NameManager::FindName(&FName::NameData,"SorcBall2",false);
        pPVar6 = ClassForSpawn(&local_4c);
        pAVar7 = AActor::StaticSpawn(pPVar6,&local_48,NO_REPLACE,false);
        if (pAVar7 != (AActor *)0x0) {
          (pAVar7->target).field_0.p = pAVar8;
        }
        local_4c.Index = FName::NameManager::FindName(&FName::NameData,"SorcBall3",false);
        pPVar6 = ClassForSpawn(&local_4c);
        pAVar7 = AActor::StaticSpawn(pPVar6,&local_48,NO_REPLACE,false);
        if (pAVar7 != (AActor *)0x0) {
          (pAVar7->target).field_0.p = pAVar8;
        }
        return 0;
      }
      __assertion = 
      "param[paramnum].Type == REGT_POINTER && (param[paramnum].atag == ATAG_STATEINFO || param[paramnum].a == NULL)"
      ;
      goto LAB_005dfcd1;
    }
    if (pAVar8 == (AActor *)0x0) goto LAB_005dfaca;
  }
LAB_005dfcc1:
  __assertion = 
  "param[paramnum].Type == REGT_POINTER && (param[paramnum].atag == ATAG_OBJECT || param[paramnum].a == NULL)"
  ;
LAB_005dfcd1:
  __assert_fail(__assertion,
                "/workspace/llm4binary/github/license_c_cmakelists/alexey-lysiuk[P]gzdoom/src/g_hexen/a_heresiarch.cpp"
                ,0xd8,"int AF_A_SorcSpinBalls(VMFrameStack *, VMValue *, int, VMReturn *, int)");
}

Assistant:

DEFINE_ACTION_FUNCTION(AActor, A_SorcSpinBalls)
{
	PARAM_ACTION_PROLOGUE_TYPE(AHeresiarch);

	AActor *mo;

	self->SpawnState += 2;		// [RH] Don't spawn balls again
	A_SlowBalls(self);
	self->args[0] = 0;								// Currently no defense
	self->args[3] = SORC_NORMAL;
	self->args[4] = SORCBALL_INITIAL_SPEED;		// Initial orbit speed
	self->BallAngle = 1.;

	DVector3 pos = self->PosPlusZ(-self->Floorclip + self->Height);
	
	mo = Spawn("SorcBall1", pos, NO_REPLACE);
	if (mo)
	{
		mo->target = self;
		mo->special2 = SORCFX4_RAPIDFIRE_TIME;
	}
	mo = Spawn("SorcBall2", pos, NO_REPLACE);
	if (mo) mo->target = self;
	mo = Spawn("SorcBall3", pos, NO_REPLACE);
	if (mo) mo->target = self;
	return 0;
}